

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void do_test_record_receipt(size_t epoch)

{
  ulong uVar1;
  int iVar2;
  st_quicly_pn_space_t *space;
  undefined8 uVar3;
  uint64_t uVar4;
  long now;
  bool bVar5;
  int64_t send_ack_at;
  uint64_t local_50;
  ulong local_48;
  uint64_t local_40;
  size_t local_38;
  
  space = alloc_pn_space(0x48,(epoch == 3) + 1);
  send_ack_at = 0x7fffffffffffffff;
  iVar2 = record_receipt(space,0,0,0x3039,&send_ack_at);
  local_38 = epoch;
  if (epoch == 3) {
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ba);
    _ok((uint)(send_ack_at == 0x3052),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bb);
    iVar2 = record_receipt(space,1,0,0x303a,&send_ack_at);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1bd);
    bVar5 = send_ack_at == 0x303a;
    local_48 = 0x303b;
    local_40 = 2;
    uVar3 = 0x1be;
  }
  else {
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1c2);
    bVar5 = send_ack_at == 0x3039;
    local_48 = 0x303a;
    local_40 = 1;
    uVar3 = 0x1c3;
  }
  _ok((uint)bVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",uVar3)
  ;
  uVar4 = local_40;
  uVar1 = local_48;
  space->unacked_count = 0;
  send_ack_at = 0x7fffffffffffffff;
  local_50 = local_40 + 1;
  iVar2 = record_receipt(space,local_40,1,local_48,&send_ack_at);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cc)
  ;
  _ok((uint)(send_ack_at == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cd)
  ;
  iVar2 = record_receipt(space,local_50,1,uVar1 + 1,&send_ack_at);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1cf)
  ;
  _ok((uint)(send_ack_at == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d0)
  ;
  local_50 = uVar4 + 4;
  iVar2 = record_receipt(space,uVar4 + 3,1,uVar1 + 2,&send_ack_at);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d3)
  ;
  _ok((uint)(send_ack_at == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d4)
  ;
  iVar2 = record_receipt(space,local_50,1,uVar1 + 3,&send_ack_at);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d6)
  ;
  _ok((uint)(send_ack_at == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1d7)
  ;
  iVar2 = record_receipt(space,uVar4 + 6,0,uVar1 | 4,&send_ack_at);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dc)
  ;
  _ok((uint)(send_ack_at == (uVar1 | 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x1dd)
  ;
  uVar1 = local_48;
  space->unacked_count = 0;
  send_ack_at = 0x7fffffffffffffff;
  if (local_38 == 3) {
    space->ignore_order = '\x01';
    uVar4 = local_40 + 9;
    iVar2 = record_receipt(space,local_40 + 8,0,local_48 + 5,&send_ack_at);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e8);
    _ok((uint)(send_ack_at == uVar1 + 0x1e),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1e9);
    now = uVar1 + 6;
    iVar2 = record_receipt(space,uVar4,0,now,&send_ack_at);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1eb);
    _ok((uint)(send_ack_at == now),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",
        0x1ec);
  }
  do_free_pn_space(space);
  return;
}

Assistant:

static void do_test_record_receipt(size_t epoch)
{
    struct st_quicly_pn_space_t *space =
        alloc_pn_space(sizeof(*space), epoch == QUICLY_EPOCH_1RTT ? QUICLY_DEFAULT_PACKET_TOLERANCE : 1);
    uint64_t pn = 0;
    int64_t now = 12345, send_ack_at = INT64_MAX;

    if (epoch == QUICLY_EPOCH_1RTT) {
        /* 2nd packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    } else {
        /* every packet triggers an ack */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* ack-only packets do not elicit an ack */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    pn++; /* gap */
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;
    ok(record_receipt(space, pn++, 1, now, &send_ack_at) == 0);
    ok(send_ack_at == INT64_MAX);
    now += 1;

    /* gap triggers an ack */
    pn += 1; /* gap */
    ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
    ok(send_ack_at == now);
    now += 1;

    /* reset */
    space->unacked_count = 0;
    send_ack_at = INT64_MAX;

    /* if 1-RTT, test ignore-order */
    if (epoch == QUICLY_EPOCH_1RTT) {
        space->ignore_order = 1;
        pn++; /* gap */
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now + QUICLY_DELAYED_ACK_TIMEOUT);
        now += 1;
        ok(record_receipt(space, pn++, 0, now, &send_ack_at) == 0);
        ok(send_ack_at == now);
        now += 1;
    }

    do_free_pn_space(space);
}